

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

uint xmlXPathNodeValHash(xmlNodePtr node)

{
  byte bVar1;
  xmlElementType xVar2;
  byte *pbVar3;
  _xmlNode *p_Var4;
  xmlNodePtr pxVar5;
  xmlChar *pxVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  _xmlNode *p_Var10;
  
  uVar8 = 0;
  if (node == (xmlNodePtr)0x0) {
    return 0;
  }
  pxVar5 = node;
  if (((node->type == XML_DOCUMENT_NODE) &&
      (pxVar5 = xmlDocGetRootElement((xmlDoc *)node), pxVar5 == (xmlNodePtr)0x0)) &&
     (pxVar5 = node->children, node->children == (xmlNodePtr)0x0)) {
    return 0;
  }
  xVar2 = pxVar5->type;
  if (XML_NAMESPACE_DECL < xVar2) {
    return 0;
  }
  if ((0x198U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
    if ((6U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
      iVar7 = 2;
      p_Var4 = pxVar5->children;
      uVar8 = 0;
LAB_001d4f72:
      do {
        do {
          p_Var10 = p_Var4;
          if (p_Var10 == (xmlNodePtr)0x0) {
            return uVar8;
          }
          uVar9 = uVar8;
          if (((p_Var10->type - XML_TEXT_NODE < 2) &&
              (pbVar3 = p_Var10->content, pbVar3 != (byte *)0x0)) && (bVar1 = *pbVar3, bVar1 != 0))
          {
            uVar9 = (uint)bVar1;
            if (iVar7 == 1) {
              return (uint)bVar1 * 0x100 + uVar8;
            }
            if (pbVar3[1] != 0) {
              return (uint)CONCAT11(pbVar3[1],bVar1);
            }
            iVar7 = 1;
          }
          p_Var4 = p_Var10->children;
          uVar8 = uVar9;
        } while ((p_Var10->type != XML_DTD_NODE && p_Var4 != (_xmlNode *)0x0) &&
                (p_Var4->type != XML_ENTITY_DECL));
        if (p_Var10 == pxVar5) {
          return uVar9;
        }
        do {
          p_Var4 = p_Var10->next;
          if (p_Var10->next != (_xmlNode *)0x0) goto LAB_001d4f72;
          p_Var10 = p_Var10->parent;
        } while ((p_Var10 != (_xmlNode *)0x0) && (p_Var10 != pxVar5));
        p_Var4 = (xmlNodePtr)0x0;
      } while( true );
    }
    if (xVar2 != XML_NAMESPACE_DECL) {
      return 0;
    }
    pxVar6 = pxVar5->name;
  }
  else {
    pxVar6 = pxVar5->content;
  }
  if ((pxVar6 != (xmlChar *)0x0) && (*pxVar6 != '\0')) {
    uVar8 = (uint)CONCAT11(pxVar6[1],*pxVar6);
  }
  return uVar8;
}

Assistant:

static unsigned int
xmlXPathNodeValHash(xmlNodePtr node) {
    int len = 2;
    const xmlChar * string = NULL;
    xmlNodePtr tmp = NULL;
    unsigned int ret = 0;

    if (node == NULL)
	return(0);

    if (node->type == XML_DOCUMENT_NODE) {
	tmp = xmlDocGetRootElement((xmlDocPtr) node);
	if (tmp == NULL)
	    node = node->children;
	else
	    node = tmp;

	if (node == NULL)
	    return(0);
    }

    switch (node->type) {
	case XML_COMMENT_NODE:
	case XML_PI_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_TEXT_NODE:
	    string = node->content;
	    if (string == NULL)
		return(0);
	    if (string[0] == 0)
		return(0);
	    return(string[0] + (string[1] << 8));
	case XML_NAMESPACE_DECL:
	    string = ((xmlNsPtr)node)->href;
	    if (string == NULL)
		return(0);
	    if (string[0] == 0)
		return(0);
	    return(string[0] + (string[1] << 8));
	case XML_ATTRIBUTE_NODE:
	    tmp = ((xmlAttrPtr) node)->children;
	    break;
	case XML_ELEMENT_NODE:
	    tmp = node->children;
	    break;
	default:
	    return(0);
    }
    while (tmp != NULL) {
	switch (tmp->type) {
	    case XML_CDATA_SECTION_NODE:
	    case XML_TEXT_NODE:
		string = tmp->content;
		break;
	    default:
                string = NULL;
		break;
	}
	if ((string != NULL) && (string[0] != 0)) {
	    if (len == 1) {
		return(ret + (string[0] << 8));
	    }
	    if (string[1] == 0) {
		len = 1;
		ret = string[0];
	    } else {
		return(string[0] + (string[1] << 8));
	    }
	}
	/*
	 * Skip to next node
	 */
	if ((tmp->children != NULL) && (tmp->type != XML_DTD_NODE)) {
	    if (tmp->children->type != XML_ENTITY_DECL) {
		tmp = tmp->children;
		continue;
	    }
	}
	if (tmp == node)
	    break;

	if (tmp->next != NULL) {
	    tmp = tmp->next;
	    continue;
	}

	do {
	    tmp = tmp->parent;
	    if (tmp == NULL)
		break;
	    if (tmp == node) {
		tmp = NULL;
		break;
	    }
	    if (tmp->next != NULL) {
		tmp = tmp->next;
		break;
	    }
	} while (tmp != NULL);
    }
    return(ret);
}